

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

_Bool upb_MiniTable_Link(upb_MiniTable *m,upb_MiniTable **sub_tables,size_t sub_table_count,
                        upb_MiniTableEnum **sub_enums,size_t sub_enum_count)

{
  byte bVar1;
  upb_MiniTableField *puVar2;
  bool bVar3;
  _Bool _Var4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  sVar8 = 0;
  bVar11 = m->field_count_dont_copy_me__upb_internal_use_only != 0;
  if (bVar11) {
    lVar6 = 0;
    uVar9 = 0;
    do {
      puVar2 = m->fields_dont_copy_me__upb_internal_use_only;
      bVar1 = (&puVar2->descriptortype_dont_copy_me__upb_internal_use_only)[lVar6];
      if (((&puVar2->mode_dont_copy_me__upb_internal_use_only)[lVar6] & 0x10) == 0) {
        bVar3 = true;
        if ((ulong)(bVar1 - 1) - 9 < 2) {
          uVar7 = (int)sVar8 + 1;
          if ((sub_table_count < uVar7) ||
             ((sub_tables[sVar8] != (upb_MiniTable *)0x0 &&
              (_Var4 = upb_MiniTable_SetSubMessage
                                 (m,(upb_MiniTableField *)
                                    ((long)&puVar2->number_dont_copy_me__upb_internal_use_only +
                                    lVar6),sub_tables[sVar8]), !_Var4)))) {
            bVar3 = false;
          }
          sVar8 = (size_t)uVar7;
        }
      }
      else {
        bVar3 = true;
        if ((bVar1 != 5) && (bVar1 != 0xc)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                        ,0x7b,
                        "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
        }
      }
      if (!bVar3) break;
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0xc;
      bVar11 = uVar9 < m->field_count_dont_copy_me__upb_internal_use_only;
    } while (bVar11);
  }
  if (!bVar11) {
    uVar9 = 0;
    bVar11 = m->field_count_dont_copy_me__upb_internal_use_only != 0;
    if (bVar11) {
      lVar6 = 0;
      uVar10 = 0;
      uVar5 = uVar9;
      do {
        bVar3 = true;
        uVar9 = uVar5;
        if (((&m->fields_dont_copy_me__upb_internal_use_only->
               descriptortype_dont_copy_me__upb_internal_use_only)[lVar6] == '\x0e') &&
           ((uVar9 = (ulong)((int)uVar5 + 1), sub_enum_count < uVar9 ||
            ((sub_enums[uVar5] != (upb_MiniTableEnum *)0x0 &&
             (_Var4 = upb_MiniTable_SetSubEnum
                                (m,(upb_MiniTableField *)
                                   ((long)&m->fields_dont_copy_me__upb_internal_use_only->
                                           number_dont_copy_me__upb_internal_use_only + lVar6),
                                 sub_enums[uVar5]), !_Var4)))))) {
          bVar3 = false;
        }
        if (!bVar3) break;
        uVar10 = uVar10 + 1;
        lVar6 = lVar6 + 0xc;
        bVar11 = uVar10 < m->field_count_dont_copy_me__upb_internal_use_only;
        uVar5 = uVar9;
      } while (bVar11);
    }
    if (!bVar11) {
      return uVar9 == sub_enum_count && sVar8 == sub_table_count;
    }
  }
  return false;
}

Assistant:

bool upb_MiniTable_Link(upb_MiniTable* m, const upb_MiniTable** sub_tables,
                        size_t sub_table_count,
                        const upb_MiniTableEnum** sub_enums,
                        size_t sub_enum_count) {
  uint32_t msg_count = 0;
  uint32_t enum_count = 0;

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_CType(f) == kUpb_CType_Message) {
      const upb_MiniTable* sub = sub_tables[msg_count++];
      if (msg_count > sub_table_count) return false;
      if (sub && !upb_MiniTable_SetSubMessage(m, f, sub)) return false;
    }
  }

  for (int i = 0; i < upb_MiniTable_FieldCount(m); i++) {
    upb_MiniTableField* f =
        (upb_MiniTableField*)upb_MiniTable_GetFieldByIndex(m, i);
    if (upb_MiniTableField_IsClosedEnum(f)) {
      const upb_MiniTableEnum* sub = sub_enums[enum_count++];
      if (enum_count > sub_enum_count) return false;
      if (sub && !upb_MiniTable_SetSubEnum(m, f, sub)) return false;
    }
  }

  return (msg_count == sub_table_count) && (enum_count == sub_enum_count);
}